

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTMath.cpp
# Opt level: O3

void __thiscall RTVector3::accelToQuaternion(RTVector3 *this,RTQuaternion *qPose)

{
  undefined1 auVar1 [16];
  uint uVar2;
  float fVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  RTVector3 z;
  RTVector3 local_40;
  RTVector3 local_34;
  undefined1 local_28 [16];
  undefined8 local_18;
  float fStack_10;
  float fStack_c;
  undefined8 extraout_XMM0_Qb;
  
  local_28._0_4_ = this->m_data[0];
  local_18._0_4_ = (float)*(undefined8 *)(this->m_data + 1);
  local_18._4_4_ = (float)((ulong)*(undefined8 *)(this->m_data + 1) >> 0x20);
  fStack_10 = 0.0;
  fStack_c = 0.0;
  RTVector3(&local_40);
  RTVector3(&local_34,0.0,0.0,1.0);
  auVar5._4_4_ = local_18._4_4_;
  auVar5._0_4_ = (float)local_18;
  auVar5._8_4_ = fStack_10;
  auVar5._12_4_ = fStack_c;
  auVar8._0_4_ = SQRT(local_18._4_4_ * local_18._4_4_ +
                      (float)local_28._0_4_ * (float)local_28._0_4_ +
                      (float)local_18 * (float)local_18);
  uVar2 = -(uint)(auVar8._0_4_ == 0.0) & 1;
  auVar8._4_4_ = auVar8._0_4_;
  auVar8._8_4_ = auVar8._0_4_;
  auVar8._12_4_ = auVar8._0_4_;
  auVar5 = divps(auVar5,auVar8);
  fVar3 = (float)local_28._0_4_ / auVar8._0_4_;
  if ((auVar8._0_4_ == 0.0) && (!NAN(auVar8._0_4_))) {
    fVar3 = (float)local_28._0_4_;
  }
  local_28 = ZEXT416((uint)fVar3);
  uVar7 = (int)(uVar2 << 0x1f) >> 0x1f;
  uVar2 = (int)(uVar2 << 0x1f) >> 0x1f;
  fStack_10 = auVar5._8_4_;
  fStack_c = auVar5._12_4_;
  local_18._0_4_ = (float)(~uVar7 & auVar5._0_4_ | (uint)(float)local_18 & uVar7);
  local_18._4_4_ = (float)(~uVar2 & auVar5._4_4_ | (uint)local_18._4_4_ & uVar2);
  fVar3 = acosf(local_18._4_4_ * local_34.m_data[2] +
                local_34.m_data[0] * fVar3 + local_34.m_data[1] * (float)local_18);
  local_40.m_data[0] = local_34.m_data[2] * (float)local_18 - local_18._4_4_ * local_34.m_data[1];
  local_40.m_data[1] =
       local_34.m_data[0] * local_18._4_4_ - (float)local_28._0_4_ * local_34.m_data[2];
  auVar9._8_4_ = local_34.m_data[2] * fStack_10 - local_18._4_4_ * 0.0;
  auVar9._0_4_ = local_40.m_data[0];
  auVar9._4_4_ = local_40.m_data[1];
  auVar9._12_4_ = local_34.m_data[2] * fStack_c - local_18._4_4_ * 0.0;
  local_40.m_data[2] =
       (float)local_28._0_4_ * local_34.m_data[1] - (float)local_18 * local_34.m_data[0];
  fVar10 = SQRT(local_40.m_data[2] * local_40.m_data[2] +
                local_40.m_data[0] * local_40.m_data[0] + local_40.m_data[1] * local_40.m_data[1]);
  if ((fVar10 != 0.0) || (NAN(fVar10))) {
    local_40.m_data[2] = local_40.m_data[2] / fVar10;
    auVar1._4_4_ = fVar10;
    auVar1._0_4_ = fVar10;
    auVar1._8_4_ = local_28._4_4_;
    auVar1._12_4_ = local_28._4_4_;
    auVar5 = divps(auVar9,auVar1);
    local_40.m_data._0_8_ = auVar5._0_8_;
  }
  local_18 = (double)fVar3 * 0.5;
  auVar6._0_8_ = sin(local_18);
  auVar6._8_8_ = extraout_XMM0_Qb;
  local_28._4_12_ = auVar6._4_12_;
  local_28._0_4_ = (undefined4)auVar6._0_8_;
  dVar4 = cos(local_18);
  qPose->m_data[0] = (float)dVar4;
  *(ulong *)(qPose->m_data + 1) =
       CONCAT44((float)local_28._0_4_ * local_40.m_data[1],
                (float)local_28._0_4_ * local_40.m_data[0]);
  qPose->m_data[3] = (float)local_28._0_4_ * local_40.m_data[2];
  return;
}

Assistant:

void RTVector3::accelToQuaternion(RTQuaternion& qPose) const
{
    RTVector3 normAccel = *this;
    RTVector3 vec;
    RTVector3 z(0, 0, 1.0);

    normAccel.normalize();

    RTFLOAT angle = acos(RTVector3::dotProduct(z, normAccel));
    RTVector3::crossProduct(normAccel, z, vec);
    vec.normalize();

    qPose.fromAngleVector(angle, vec);
}